

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O3

bool __thiscall
duckdb::StreamQueryResult::IsOpenInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  ClientContext *pCVar1;
  pointer pAVar2;
  bool bVar3;
  
  bVar3 = false;
  if (((this->super_QueryResult).super_BaseQueryResult.success == true) &&
     (bVar3 = false,
     (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr != (element_type *)0x0)) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    if ((pCVar1->active_query).
        super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
        .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl ==
        (ActiveQueryContext *)0x0) {
      bVar3 = false;
    }
    else {
      pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
               ::operator->(&pCVar1->active_query);
      bVar3 = (StreamQueryResult *)pAVar2->open_result == this;
    }
  }
  return bVar3;
}

Assistant:

bool StreamQueryResult::IsOpenInternal(ClientContextLock &lock) {
	bool invalidated = !success || !context;
	if (!invalidated) {
		invalidated = !context->IsActiveResult(lock, *this);
	}
	return !invalidated;
}